

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLifetimeTests.cpp
# Opt level: O0

void __thiscall
deqp::gls::LifetimeTests::details::RboFboAttacher::attach
          (RboFboAttacher *this,GLuint rbo,GLuint fbo)

{
  GLenum GVar1;
  deBool dVar2;
  Functions *pFVar3;
  GLuint fbo_local;
  GLuint rbo_local;
  RboFboAttacher *this_local;
  
  do {
    glu::CallLogWrapper::glBindFramebuffer
              (&(this->super_FboAttacher).super_Attacher.super_ContextWrapper.super_CallLogWrapper,
               0x8d40,fbo);
    pFVar3 = ContextWrapper::gl(&(this->super_FboAttacher).super_Attacher.super_ContextWrapper);
    GVar1 = (*pFVar3->getError)();
    glu::checkError(GVar1,"glBindFramebuffer(GL_FRAMEBUFFER, fbo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsLifetimeTests.cpp"
                    ,0x17c);
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    glu::CallLogWrapper::glFramebufferRenderbuffer
              (&(this->super_FboAttacher).super_Attacher.super_ContextWrapper.super_CallLogWrapper,
               0x8d40,0x8ce0,0x8d41,rbo);
    pFVar3 = ContextWrapper::gl(&(this->super_FboAttacher).super_Attacher.super_ContextWrapper);
    GVar1 = (*pFVar3->getError)();
    glu::checkError(GVar1,
                    "glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, rbo)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsLifetimeTests.cpp"
                    ,0x17f);
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    glu::CallLogWrapper::glBindFramebuffer
              (&(this->super_FboAttacher).super_Attacher.super_ContextWrapper.super_CallLogWrapper,
               0x8d40,0);
    pFVar3 = ContextWrapper::gl(&(this->super_FboAttacher).super_Attacher.super_ContextWrapper);
    GVar1 = (*pFVar3->getError)();
    glu::checkError(GVar1,"glBindFramebuffer(GL_FRAMEBUFFER, 0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsLifetimeTests.cpp"
                    ,0x182);
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  return;
}

Assistant:

void RboFboAttacher::attach (GLuint rbo, GLuint fbo)
{
	GLU_CHECK_CALL_ERROR(
		glBindFramebuffer(GL_FRAMEBUFFER, fbo),
		gl().getError());
	GLU_CHECK_CALL_ERROR(
		glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, rbo),
		gl().getError());
	GLU_CHECK_CALL_ERROR(
		glBindFramebuffer(GL_FRAMEBUFFER, 0),
		gl().getError());
}